

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

ArrayNewElem * __thiscall
wasm::Builder::makeArrayNewElem
          (Builder *this,HeapType type,Name seg,Expression *offset,Expression *size)

{
  ArrayNewElem *this_00;
  
  this_00 = (ArrayNewElem *)MixedArena::allocSpace(&this->wasm->allocator,0x30,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression._id =
       ArrayNewElemId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id = 0;
  (this_00->segment).super_IString.str._M_len = seg.super_IString.str._M_len;
  (this_00->segment).super_IString.str._M_str = seg.super_IString.str._M_str;
  this_00->offset = offset;
  this_00->size = size;
  if (((uint)(0x7c < type.id) * 4 + 3 & (uint)type.id) == 0) {
    (this_00->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id = type.id
    ;
    ArrayNewElem::finalize(this_00);
    return this_00;
  }
  __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
}

Assistant:

ArrayNewElem* makeArrayNewElem(HeapType type,
                                 Name seg,
                                 Expression* offset,
                                 Expression* size) {
    auto* ret = wasm.allocator.alloc<ArrayNewElem>();
    ret->segment = seg;
    ret->offset = offset;
    ret->size = size;
    ret->type = Type(type, NonNullable);
    ret->finalize();
    return ret;
  }